

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O3

void __thiscall wasm::RemoveNonJSOpsPass::visitBinary(RemoveNonJSOpsPass *this,Binary *curr)

{
  BinaryOp BVar1;
  Builder *this_00;
  Name target;
  size_t *psVar2;
  Call *expression;
  initializer_list<wasm::Expression_*> __l;
  Expression *local_78;
  Expression *pEStack_70;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *local_60;
  __node_gen_type __node_gen;
  pointer local_50;
  size_t local_48;
  char *pcStack_40;
  allocator_type local_31;
  
  local_48 = 0;
  pcStack_40 = (char *)0x0;
  BVar1 = curr->op;
  if ((int)BVar1 < 0x1b) {
    if (BVar1 == RotLInt32) {
      psVar2 = &WASM_ROTL32;
    }
    else {
      if (BVar1 != RotRInt32) {
        return;
      }
      psVar2 = &WASM_ROTR32;
    }
    goto LAB_00a7ab5e;
  }
  switch(BVar1) {
  case MulInt64:
    psVar2 = &WASM_I64_MUL;
    break;
  case DivSInt64:
    psVar2 = &WASM_I64_SDIV;
    break;
  case DivUInt64:
    psVar2 = &WASM_I64_UDIV;
    break;
  case RemSInt64:
    psVar2 = &WASM_I64_SREM;
    break;
  case RemUInt64:
    psVar2 = &WASM_I64_UREM;
    break;
  case AndInt64:
  case OrInt64:
  case XorInt64:
  case ShlInt64:
  case ShrSInt64:
  case ShrUInt64:
    goto switchD_00a7aad8_caseD_20;
  case RotLInt64:
    psVar2 = &WASM_ROTL64;
    break;
  case RotRInt64:
    psVar2 = &WASM_ROTR64;
    break;
  default:
    if ((BVar1 == CopySignFloat64) || (BVar1 == CopySignFloat32)) {
      rewriteCopysign(this,curr);
      return;
    }
    goto switchD_00a7aad8_caseD_20;
  }
LAB_00a7ab5e:
  local_48 = *psVar2;
  pcStack_40 = (char *)psVar2[1];
  local_60 = &this->neededIntrinsics;
  std::
  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
            ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_60,&local_48);
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  target.super_IString.str._M_str = pcStack_40;
  target.super_IString.str._M_len = local_48;
  local_78 = curr->left;
  pEStack_70 = curr->right;
  __l._M_len = 2;
  __l._M_array = &local_78;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             &stack0xffffffffffffffa0,__l,&local_31);
  expression = Builder::makeCall(this_00,target,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 &stack0xffffffffffffffa0,
                                 (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)16>).
                                       super_Expression.type.id,false);
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,(Expression *)expression);
  if (local_60 !=
      (unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
       *)0x0) {
    operator_delete(local_60,(long)local_50 - (long)local_60);
  }
switchD_00a7aad8_caseD_20:
  return;
}

Assistant:

void visitBinary(Binary* curr) {
    Name name;
    switch (curr->op) {
      case CopySignFloat32:
      case CopySignFloat64:
        rewriteCopysign(curr);
        return;

      case RotLInt32:
        name = WASM_ROTL32;
        break;
      case RotRInt32:
        name = WASM_ROTR32;
        break;
      case RotLInt64:
        name = WASM_ROTL64;
        break;
      case RotRInt64:
        name = WASM_ROTR64;
        break;
      case MulInt64:
        name = WASM_I64_MUL;
        break;
      case DivSInt64:
        name = WASM_I64_SDIV;
        break;
      case DivUInt64:
        name = WASM_I64_UDIV;
        break;
      case RemSInt64:
        name = WASM_I64_SREM;
        break;
      case RemUInt64:
        name = WASM_I64_UREM;
        break;

      default:
        return;
    }
    neededIntrinsics.insert(name);
    replaceCurrent(
      builder->makeCall(name, {curr->left, curr->right}, curr->type));
  }